

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

bool __thiscall QAbstractButton::event(QAbstractButton *this,QEvent *e)

{
  long lVar1;
  FocusPolicy FVar2;
  QWidget *this_00;
  uint uVar3;
  bool bVar4;
  
  if ((((this->super_QWidget).data)->widget_attributes & 1) != 0) {
    uVar3 = *(ushort *)(e + 8) - 0x52;
    if ((uVar3 < 0x30) && ((0xe00000000c21U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      return true;
    }
    if (*(ushort *)(e + 8) - 2 < 4) {
      return true;
    }
  }
  if (*(short *)(e + 8) == 0x75) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    bVar4 = *(int *)(lVar1 + 0x288) == *(int *)(e + 0x18);
    if (bVar4) {
      if (e[0x1c] == (QEvent)0x0) {
        bVar4 = true;
        if (*(int *)(lVar1 + 0x29c) == 0) {
          animateClick(this);
        }
      }
      else {
        FVar2 = QWidget::focusPolicy(&this->super_QWidget);
        if (FVar2 != NoFocus) {
          QWidget::setFocus(&this->super_QWidget,ShortcutFocusReason);
        }
        this_00 = QWidget::window(&this->super_QWidget);
        QWidget::setAttribute(this_00,WA_KeyboardFocusChange,true);
        bVar4 = true;
      }
    }
    return bVar4;
  }
  bVar4 = QWidget::event(&this->super_QWidget,e);
  return bVar4;
}

Assistant:

bool QAbstractButton::event(QEvent *e)
{
    // as opposed to other widgets, disabled buttons accept mouse
    // events. This avoids surprising click-through scenarios
    if (!isEnabled()) {
        switch(e->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::HoverMove:
        case QEvent::HoverEnter:
        case QEvent::HoverLeave:
        case QEvent::ContextMenu:
            return true;
        default:
            break;
        }
    }

#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        Q_D(QAbstractButton);
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (d->shortcutId != se->shortcutId())
            return false;
        if (!se->isAmbiguous()) {
            if (!d->animateTimer.isActive())
                animateClick();
        } else {
            if (focusPolicy() != Qt::NoFocus)
                setFocus(Qt::ShortcutFocusReason);
            window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        return true;
    }
#endif
    return QWidget::event(e);
}